

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

void list_insert_after(list *list,list_elem *after,list_elem *e)

{
  list_elem *plVar1;
  list_elem *plVar2;
  
  plVar1 = after->next;
  e->next = plVar1;
  e->prev = after;
  plVar2 = (list_elem *)&list->tail;
  if (plVar1 != (list_elem *)0x0) {
    plVar2 = plVar1;
  }
  plVar2->prev = e;
  after->next = e;
  return;
}

Assistant:

void list_insert_after(struct list *list, struct list_elem *after, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    e->next = after->next;
    e->prev = after;
    if (after->next) after->next->prev = e;
    else list->tail = e;
    after->next = e;
    IFDEF_LOCK( spin_unlock(&list->lock); );
}